

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O3

MergeResult
mergesort_cache_lcp_2way<true,unsigned_int>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          uint *cache_input,uint *cache_output,size_t n)

{
  lcp_t *lcp_input_00;
  lcp_t *lcp_output_00;
  uint *cache_input_00;
  uint *cache_output_00;
  byte *pbVar1;
  byte *pbVar2;
  uchar *puVar3;
  int iVar4;
  MergeResult MVar5;
  MergeResult MVar6;
  uchar **ppuVar7;
  uchar *puVar8;
  uint uVar9;
  size_t n_00;
  uchar **ppuVar10;
  lcp_t lVar11;
  ulong uVar12;
  byte bVar13;
  byte bVar14;
  uint uVar15;
  long lVar16;
  uchar uVar17;
  ulong uVar18;
  
  if (0x1f < n) {
    uVar18 = n >> 1;
    MVar5 = mergesort_cache_lcp_2way<true,unsigned_int>
                      (strings_input,strings_output,lcp_input,lcp_output,cache_input,cache_output,
                       uVar18);
    n_00 = n - uVar18;
    ppuVar7 = strings_input + uVar18;
    ppuVar10 = strings_output + uVar18;
    lcp_input_00 = lcp_input + uVar18;
    lcp_output_00 = lcp_output + uVar18;
    cache_input_00 = cache_input + uVar18;
    cache_output_00 = cache_output + uVar18;
    if (MVar5 == SortedInPlace) {
      check_input<unsigned_int>(strings_input,lcp_input,cache_input,uVar18);
      MVar6 = mergesort_cache_lcp_2way<true,unsigned_int>
                        (ppuVar7,ppuVar10,lcp_input_00,lcp_output_00,cache_input_00,cache_output_00,
                         n_00);
      check_input<unsigned_int>(ppuVar7,lcp_input_00,cache_input_00,n_00);
      if (MVar6 == SortedInPlace) {
        merge_cache_lcp_2way<true,unsigned_int>
                  (strings_input,lcp_input,cache_input,uVar18,ppuVar7,lcp_input_00,cache_input_00,
                   n_00,strings_output,lcp_output,cache_output);
        return SortedInTemp;
      }
      memmove(strings_output,strings_input,uVar18 * 8);
      memcpy(cache_output,cache_input,uVar18 * 4);
      memcpy(lcp_output,lcp_input,uVar18 * 8);
      MVar5 = SortedInTemp;
    }
    else {
      check_input<unsigned_int>(strings_output,lcp_output,cache_output,uVar18);
      MVar6 = mergesort_cache_lcp_2way<true,unsigned_int>
                        (ppuVar7,ppuVar10,lcp_input_00,lcp_output_00,cache_input_00,cache_output_00,
                         n_00);
      check_input<unsigned_int>(ppuVar10,lcp_output_00,cache_output_00,n_00);
      if (MVar5 == MVar6) goto LAB_001d9381;
      memmove(strings_input,strings_output,uVar18 * 8);
      memcpy(cache_input,cache_output,uVar18 * 4);
      memcpy(lcp_input,lcp_output,uVar18 * 8);
      MVar6 = SortedInTemp;
    }
    if (MVar5 != MVar6) {
      __assert_fail("m0 == m1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x56e,
                    "MergeResult mergesort_cache_lcp_2way(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = true, CharT = unsigned int]"
                   );
    }
LAB_001d9381:
    merge_cache_lcp_2way<true,unsigned_int>
              (strings_output,lcp_output,cache_output,uVar18,ppuVar10,lcp_output_00,cache_output_00,
               n_00,strings_input,lcp_input,cache_input);
    return SortedInPlace;
  }
  if (1 < n) {
    uVar18 = n & 0xffffffff;
    ppuVar7 = strings_input;
    do {
      pbVar1 = ppuVar7[1];
      ppuVar7 = ppuVar7 + 1;
      for (ppuVar10 = ppuVar7; strings_input < ppuVar10; ppuVar10 = ppuVar10 + -1) {
        pbVar2 = ppuVar10[-1];
        bVar13 = *pbVar2;
        bVar14 = *pbVar1;
        if (bVar13 != 0 && bVar13 == bVar14) {
          lVar16 = 1;
          do {
            bVar13 = pbVar2[lVar16];
            bVar14 = pbVar1[lVar16];
            if (bVar13 == 0) break;
            lVar16 = lVar16 + 1;
          } while (bVar13 == bVar14);
        }
        if (bVar13 <= bVar14) break;
        *ppuVar10 = pbVar2;
      }
      iVar4 = (int)uVar18;
      *ppuVar10 = pbVar1;
      uVar18 = (ulong)(iVar4 - 1);
    } while (2 < iVar4);
  }
  pbVar1 = *strings_input;
  puVar8 = strings_input[1];
  bVar13 = *pbVar1;
  if (bVar13 == 0) {
    *lcp_input = 0;
  }
  else {
    lVar11 = 0;
    bVar14 = bVar13;
    do {
      if (bVar14 != puVar8[lVar11]) break;
      bVar14 = pbVar1[lVar11 + 1];
      lVar11 = lVar11 + 1;
    } while (bVar14 != 0);
    *lcp_input = lVar11;
    if (bVar13 != 0) {
      uVar9 = (uint)bVar13 << 0x18;
      if (pbVar1[1] != 0) {
        uVar9 = uVar9 | (uint)pbVar1[1] << 0x10;
        if (pbVar1[2] != 0) {
          uVar9 = uVar9 | CONCAT11(pbVar1[2],pbVar1[3]);
        }
      }
      goto LAB_001d91ba;
    }
  }
  uVar9 = 0;
LAB_001d91ba:
  *cache_input = uVar9;
  if (1 < n - 1) {
    uVar18 = 1;
    uVar9 = 1;
    do {
      uVar12 = (ulong)(uVar9 + 1);
      puVar3 = strings_input[uVar12];
      lVar11 = 0;
      uVar17 = *puVar8;
      while ((uVar17 != '\0' && (uVar17 == puVar3[lVar11]))) {
        lVar16 = lVar11 + 1;
        lVar11 = lVar11 + 1;
        uVar17 = puVar8[lVar16];
      }
      lcp_input[uVar18] = lVar11;
      lVar11 = lcp_input[uVar9 - 1];
      if (puVar8[lVar11] == 0) {
        uVar15 = 0;
      }
      else {
        uVar15 = (uint)puVar8[lVar11] << 0x18;
        if (puVar8[lVar11 + 1] != 0) {
          uVar15 = uVar15 | (uint)puVar8[lVar11 + 1] << 0x10;
          if (puVar8[lVar11 + 2] != '\0') {
            uVar15 = uVar15 | CONCAT11(puVar8[lVar11 + 2],puVar8[lVar11 + 3]);
          }
        }
      }
      cache_input[uVar18] = uVar15;
      puVar8 = puVar3;
      uVar18 = uVar12;
      uVar9 = uVar9 + 1;
    } while (uVar12 < n - 1);
  }
  puVar8 = strings_input[n - 1];
  if (puVar8 != (uchar *)0x0) {
    lVar11 = lcp_input[n - 2];
    uVar9 = 0;
    if (puVar8[lVar11] != 0) {
      uVar9 = (uint)puVar8[lVar11] << 0x18;
      if (puVar8[lVar11 + 1] != 0) {
        uVar9 = (uint)puVar8[lVar11 + 1] << 0x10 | uVar9;
        if (puVar8[lVar11 + 2] != '\0') {
          uVar9 = uVar9 | CONCAT11(puVar8[lVar11 + 2],puVar8[lVar11 + 3]);
        }
      }
    }
    cache_input[n - 1] = uVar9;
    check_input<unsigned_int>(strings_input,lcp_input,cache_input,n);
    return SortedInPlace;
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                ,0x38,"uint32_t get_char(unsigned char *, size_t)");
}

Assistant:

MergeResult
mergesort_cache_lcp_2way(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0 = mergesort_cache_lcp_2way<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	MergeResult m1 = mergesort_cache_lcp_2way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}